

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model.cc
# Opt level: O0

void __thiscall
fasttext::Model::computeHidden(Model *this,vector<int,_std::allocator<int>_> *input,Vector *hidden)

{
  bool bVar1;
  int64_t iVar2;
  const_iterator this_00;
  const_iterator A;
  size_type sVar3;
  __shared_ptr_access<fasttext::Matrix,_(__gnu_cxx::_Lock_policy)2,_false,_false> *in_RDX;
  vector<int,_std::allocator<int>_> *in_RSI;
  Vector *in_RDI;
  undefined1 auVar4 [16];
  undefined1 in_ZMM0 [64];
  const_iterator it;
  vector<int,_std::allocator<int>_> *in_stack_ffffffffffffffa8;
  __shared_ptr_access<fasttext::Matrix,_(__gnu_cxx::_Lock_policy)2,_false,_false>
  *in_stack_ffffffffffffffb0;
  QMatrix *in_stack_ffffffffffffffb8;
  Vector *in_stack_ffffffffffffffc0;
  __shared_ptr_access<fasttext::Matrix,_(__gnu_cxx::_Lock_policy)2,_false,_false> *this_01;
  element_type *in_stack_ffffffffffffffc8;
  real a;
  
  iVar2 = Vector::size((Vector *)0x1917e7);
  if (iVar2 == *(int *)&in_RDI[7].data_.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                        super__Vector_impl_data._M_start) {
    Vector::zero(in_stack_ffffffffffffffc0);
    this_00 = std::vector<int,_std::allocator<int>_>::cbegin(in_stack_ffffffffffffffa8);
    while( true ) {
      A = std::vector<int,_std::allocator<int>_>::cend(in_stack_ffffffffffffffa8);
      bVar1 = __gnu_cxx::operator!=
                        ((__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> *)
                         in_stack_ffffffffffffffb0,
                         (__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> *)
                         in_stack_ffffffffffffffa8);
      a = (real)((ulong)in_stack_ffffffffffffffc8 >> 0x20);
      auVar4 = in_ZMM0._0_16_;
      if (!bVar1) break;
      if (((ulong)in_RDI[0xe].data_.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage & 1) == 0) {
        in_stack_ffffffffffffffb0 = in_RDX;
        in_stack_ffffffffffffffb8 =
             (QMatrix *)
             std::__shared_ptr_access<fasttext::Matrix,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator*(in_RDX);
        __gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>::
        operator*((__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> *)
                  &stack0xffffffffffffffe0);
        Vector::addRow((Vector *)this_00._M_current,(Matrix *)A._M_current,(int64_t)in_RDI);
      }
      else {
        this_01 = in_RDX;
        in_stack_ffffffffffffffc8 =
             std::__shared_ptr_access<fasttext::QMatrix,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator*((__shared_ptr_access<fasttext::QMatrix,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)in_stack_ffffffffffffffb0);
        __gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>::
        operator*((__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> *)
                  &stack0xffffffffffffffe0);
        Vector::addRow((Vector *)this_01,in_stack_ffffffffffffffb8,
                       (int64_t)in_stack_ffffffffffffffb0);
      }
      __gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
                ((__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> *)
                 &stack0xffffffffffffffe0);
    }
    sVar3 = std::vector<int,_std::allocator<int>_>::size(in_RSI);
    vcvtusi2sd_avx512f(auVar4,sVar3);
    Vector::mul(in_RDI,a);
    return;
  }
  __assert_fail("hidden.size() == hsz_",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Whadup[P]weightedFastText/src/model.cc"
                ,0x9e,
                "void fasttext::Model::computeHidden(const std::vector<int32_t> &, Vector &) const")
  ;
}

Assistant:

void Model::computeHidden(const std::vector<int32_t>& input, Vector& hidden)
		const {
	assert(hidden.size() == hsz_);
	hidden.zero();
	for (auto it = input.cbegin(); it != input.cend(); ++it) {
		if (quant_) {
			hidden.addRow(*qwi_, *it);
		} else {
			hidden.addRow(*wi_, *it);
		}
	}
	hidden.mul(1.0 / input.size());
}